

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [64];
  float fVar22;
  float fVar23;
  float zero_deadzone_halfsize;
  undefined1 extraout_var [56];
  
  pIVar6 = GImGui;
  uVar11 = flags & 0x100000;
  uVar10 = data_type & 0xfffffffe;
  uVar8 = v_min - v_max;
  uVar9 = -uVar8;
  if (0 < (int)uVar8) {
    uVar9 = uVar8;
  }
  fVar23 = *(float *)((long)&(bb->Min).x + (ulong)(uVar11 >> 0x12));
  fVar20 = *(float *)((long)&(bb->Max).x + (ulong)(uVar11 >> 0x12));
  fVar2 = (fVar20 - fVar23) + -4.0;
  fVar14 = (GImGui->Style).GrabMinSize;
  if (uVar10 != 8) {
    fVar22 = fVar2 / (float)(int)(uVar9 + 1);
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)fVar22),2);
    bVar12 = (bool)((byte)uVar4 & 1);
    fVar14 = (float)((uint)bVar12 * (int)fVar22 + (uint)!bVar12 * (int)fVar14);
  }
  auVar3 = vminss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar2));
  fVar14 = fVar2 - auVar3._0_4_;
  zero_deadzone_halfsize = 0.0;
  fVar22 = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar10 == 8) {
      iVar7 = ImParseFormatPrecision(format,3);
      fVar22 = (float)iVar7;
    }
    else {
      fVar22 = 1.0;
    }
    fVar22 = powf(0.1,fVar22);
    auVar16 = vmaxss_avx(ZEXT416((uint)fVar14),ZEXT416(0x3f800000));
    zero_deadzone_halfsize = ((pIVar6->Style).LogSliderDeadzone * 0.5) / auVar16._0_4_;
  }
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 + 2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0));
  fVar23 = auVar16._0_4_;
  if (pIVar6->ActiveId != id) {
    bVar12 = false;
    goto LAB_0030240c;
  }
  if (pIVar6->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar6->ActiveIdIsJustActivated == true) {
      pIVar6->SliderCurrentAccum = 0.0;
      pIVar6->SliderCurrentAccumDirty = false;
    }
    auVar21._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    auVar21._8_56_ = extraout_var;
    auVar16 = vmovshdup_avx(auVar21._0_16_);
    auVar17._8_4_ = 0x80000000;
    auVar17._0_8_ = 0x8000000080000000;
    auVar17._12_4_ = 0x80000000;
    auVar16 = vxorps_avx512vl(auVar16,auVar17);
    auVar16._0_4_ =
         (float)((uint)(uVar11 == 0) * (int)auVar21._0_4_ + (uint)(uVar11 != 0) * auVar16._0_4_);
    if ((auVar16._0_4_ != 0.0) || (NAN(auVar16._0_4_))) {
      if ((uVar10 == 8) && (iVar7 = ImParseFormatPrecision(format,3), 0 < iVar7)) {
        uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
        bVar12 = (bool)((byte)uVar4 & 1);
        fVar14 = (float)((uint)bVar12 * (int)((auVar16._0_4_ / 100.0) / 10.0) +
                        (uint)!bVar12 * (int)(auVar16._0_4_ / 100.0));
      }
      else if ((uVar9 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
        uVar4 = vcmpss_avx512f(auVar16,ZEXT816(0) << 0x40,1);
        bVar12 = (bool)((byte)uVar4 & 1);
        fVar14 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * 0x3f800000) /
                 (float)(int)uVar9;
      }
      else {
        fVar14 = auVar16._0_4_ / 100.0;
      }
      uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
      bVar12 = (bool)((byte)uVar4 & 1);
      pIVar6->SliderCurrentAccum =
           (float)((uint)bVar12 * (int)(fVar14 * 10.0) + (uint)!bVar12 * (int)fVar14) +
           pIVar6->SliderCurrentAccum;
      pIVar6->SliderCurrentAccumDirty = true;
    }
    fVar14 = pIVar6->SliderCurrentAccum;
    if ((pIVar6->NavActivatePressedId == id) && (pIVar6->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if (pIVar6->SliderCurrentAccumDirty == true) {
      uVar9 = (flags & 0x20U) >> 5;
      bVar12 = SUB41(uVar9,0);
      fVar18 = ScaleRatioFromValueT<int,int,float>
                         (data_type,*v,v_min,v_max,bVar12,fVar22,zero_deadzone_halfsize);
      fVar15 = fVar18;
      if ((fVar18 < 1.0) || (fVar14 <= 0.0)) {
        fVar19 = 0.0;
        if ((0.0 < fVar18) || (0.0 <= fVar14)) {
          auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar14 + fVar18)));
          uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar14 + fVar18)),ZEXT816(0),1);
          fVar15 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar16._0_4_);
          iVar7 = ScaleValueFromRatioT<int,int,float>
                            (data_type,fVar15,v_min,v_max,bVar12,fVar22,zero_deadzone_halfsize);
          if ((flags & 0x40U) == 0) {
            iVar7 = RoundScalarWithFormatT<int,int>
                              ((ImGui *)format,(char *)(ulong)(uint)data_type,iVar7,uVar9);
          }
          fVar19 = ScaleRatioFromValueT<int,int,float>
                             (data_type,iVar7,v_min,v_max,bVar12,fVar22,zero_deadzone_halfsize);
          fVar19 = fVar19 - fVar18;
          if (fVar14 <= 0.0) {
            uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)fVar19),2);
            bVar12 = (bool)((byte)uVar4 & 1);
            fVar19 = (float)((uint)bVar12 * (int)fVar19 + (uint)!bVar12 * (int)fVar14);
          }
          else {
            auVar16 = vminss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar14));
            fVar19 = auVar16._0_4_;
          }
          fVar19 = pIVar6->SliderCurrentAccum - fVar19;
          bVar12 = true;
        }
        else {
          bVar12 = false;
        }
      }
      else {
        bVar12 = false;
        fVar19 = 0.0;
      }
      pIVar6->SliderCurrentAccum = fVar19;
      pIVar6->SliderCurrentAccumDirty = false;
      goto LAB_00302394;
    }
    bVar12 = false;
    fVar15 = 0.0;
  }
  else {
    fVar15 = 0.0;
    if (pIVar6->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar6->IO).MouseDown[0] == false) {
        ClearActiveID();
        fVar15 = 0.0;
        bVar12 = false;
      }
      else {
        fVar15 = 0.0;
        if (0.0 < fVar14) {
          auVar17 = ZEXT416((uint)((*(float *)((pIVar6->IO).MouseDown +
                                              (ulong)(uVar11 >> 0x14) * 4 + -8) - fVar23) / fVar14))
          ;
          auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar17);
          uVar4 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,1);
          fVar15 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar16._0_4_);
        }
        fVar15 = (float)((uint)(uVar11 == 0) * (int)fVar15 +
                        (uint)(uVar11 != 0) * (int)(1.0 - fVar15));
        bVar12 = true;
      }
    }
    else {
      bVar12 = false;
    }
  }
LAB_00302394:
  if (bVar12) {
    uVar9 = (flags & 0x20U) >> 5;
    iVar7 = ScaleValueFromRatioT<int,int,float>
                      (data_type,fVar15,v_min,v_max,SUB41(uVar9,0),fVar22,zero_deadzone_halfsize);
    if ((flags & 0x40U) == 0) {
      iVar7 = RoundScalarWithFormatT<int,int>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,iVar7,uVar9);
    }
    bVar12 = *v != iVar7;
    if (bVar12) {
      *v = iVar7;
      bVar12 = true;
    }
  }
  else {
    bVar12 = false;
  }
LAB_0030240c:
  if (1.0 <= fVar2) {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar17 = vxorps_avx512vl(auVar3,auVar5);
    auVar16 = vfnmadd231ss_fma(ZEXT416((uint)(fVar20 + -2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0))
    ;
    fVar20 = ScaleRatioFromValueT<int,int,float>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar22,
                        zero_deadzone_halfsize);
    bVar13 = uVar11 == 0;
    auVar16 = vfmadd213ss_fma(ZEXT416((uint)(auVar16._0_4_ - fVar23)),
                              ZEXT416((uint)bVar13 * (int)fVar20 +
                                      (uint)!bVar13 * (int)(1.0 - fVar20)),ZEXT416((uint)fVar23));
    if (bVar13) {
      auVar17 = vfmadd213ss_fma(auVar17,SUB6416(ZEXT464(0x3f000000),0),auVar16);
      fVar23 = (bb->Min).y;
      fVar20 = (bb->Max).y;
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar16);
      (out_grab_bb->Min).x = auVar17._0_4_;
      (out_grab_bb->Min).y = fVar23 + 2.0;
      (out_grab_bb->Max).x = auVar3._0_4_;
      (out_grab_bb->Max).y = fVar20 + -2.0;
    }
    else {
      fVar23 = (bb->Max).x;
      auVar17 = vfmadd213ss_fma(auVar17,SUB6416(ZEXT464(0x3f000000),0),auVar16);
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar16);
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = auVar17._0_4_;
      (out_grab_bb->Max).x = fVar23 + -2.0;
      (out_grab_bb->Max).y = auVar3._0_4_;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar12;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}